

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.cpp
# Opt level: O1

string * fs_resolve_abi_cxx11_
                   (string *__return_storage_ptr__,string_view path,bool strict,bool expand_tilde)

{
  string_view path_00;
  string local_38;
  
  fs_absolute_abi_cxx11_(&local_38,path,expand_tilde);
  path_00._M_str = local_38._M_dataplus._M_p;
  path_00._M_len = local_38._M_string_length;
  fs_canonical_abi_cxx11_(__return_storage_ptr__,path_00,strict,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string fs_resolve(std::string_view path, const bool strict, const bool expand_tilde)
{
  // works like canonical(absolute(path)).
  // Inspired by Python pathlib.Path.resolve()
  // https://docs.python.org/3/library/pathlib.html#pathlib.Path.resolve

  return fs_canonical(fs_absolute(path, expand_tilde), strict, false);
}